

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::InvalidateCachedOuterScopes(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  Scope *pSVar5;
  uint C1;
  
  RVar3 = FuncInfo::GetEnvRegister(funcInfo);
  if (RVar3 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x857,"(funcInfo->GetEnvRegister() != Js::Constants::NoRegister)",
                       "funcInfo->GetEnvRegister() != Js::Constants::NoRegister");
    if (!bVar2) {
LAB_0080f9f1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pSVar5 = funcInfo->bodyScope;
  do {
    pSVar5 = pSVar5->enclosingScope;
    if (pSVar5 == (Scope *)0x0) {
      return;
    }
  } while (pSVar5->func == funcInfo);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  C1 = 0;
  do {
    if ((pSVar5 == pSVar5->func->bodyScope) && ((~*(uint *)&pSVar5->func->field_0xb4 & 0x900) == 0))
    {
      if ((pSVar5->field_0x44 & 2) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x86b,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar2) goto LAB_0080f9f1;
        *puVar4 = 0;
      }
      Js::ByteCodeWriter::Unsigned1(&this->m_writer,InvalCachedScope,C1);
    }
    C1 = C1 + ((*(uint *)&pSVar5->field_0x44 >> 4 & 1) != 0);
    pSVar5 = pSVar5->enclosingScope;
    if (pSVar5 == (Scope *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void ByteCodeGenerator::InvalidateCachedOuterScopes(FuncInfo *funcInfo)
{
    Assert(funcInfo->GetEnvRegister() != Js::Constants::NoRegister);

    // Walk the scope stack, from funcInfo outward, looking for scopes that have been cached.

    Scope *scope = funcInfo->GetBodyScope()->GetEnclosingScope();
    uint32 envIndex = 0;

    while (scope && scope->GetFunc() == funcInfo)
    {
        // Skip over FuncExpr Scope and parameter scope for current funcInfo to get to the first enclosing scope of the outer function.
        scope = scope->GetEnclosingScope();
    }

    for (; scope; scope = scope->GetEnclosingScope())
    {
        FuncInfo *func = scope->GetFunc();
        if (scope == func->GetBodyScope())
        {
            if (func->Escapes() && func->GetHasCachedScope())
            {
                AssertOrFailFast(scope->GetIsObject());
                this->m_writer.Unsigned1(Js::OpCode::InvalCachedScope, envIndex);
            }
        }
        if (scope->GetMustInstantiate())
        {
            envIndex++;
        }
    }
}